

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

FIOBJ http_mimetype_find2(FIOBJ url)

{
  int *piVar1;
  long lVar2;
  ulong uVar3;
  FIOBJ FVar4;
  char *pcVar5;
  byte bVar6;
  __int32_t **pp_Var7;
  FIOBJ FVar8;
  fiobj_object_vtable_s *pfVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  char *file_ext;
  char cVar13;
  long lVar14;
  size_t file_ext_len;
  long *in_FS_OFFSET;
  fio_str_info_s tmp;
  fio_str_info_s local_48;
  
  if (url != 0) {
    cVar13 = (char)url;
    if ((url & 1) == 0) {
      switch((uint)url & 6) {
      case 0:
        cVar13 = *(char *)(url & 0xfffffffffffffff8);
LAB_0014f1ae:
        switch(cVar13) {
        case '\'':
          pfVar9 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          goto switchD_0014f1a3_caseD_2;
        case ')':
          pfVar9 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          goto switchD_0014f1a3_caseD_4;
        case '+':
          pfVar9 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar9 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_0014f1a3_caseD_2:
        pfVar9 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_0014f1a3_caseD_4:
        pfVar9 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if (cVar13 == '&') {
          local_48.data = anon_var_dwarf_217;
          local_48.len._0_4_ = 5;
        }
        else {
          uVar11 = (uint)url & 0xff;
          if (uVar11 == 0x16) {
            local_48.data = anon_var_dwarf_222;
            local_48.len._0_4_ = 4;
          }
          else {
            if (uVar11 != 6) goto LAB_0014f1ae;
            local_48.data = anon_var_dwarf_20c;
            local_48.len._0_4_ = 4;
          }
        }
        local_48.len._4_4_ = 0;
        local_48.capa._4_4_ = 0;
        local_48.capa._0_4_ = 0;
        goto LAB_0014f1f9;
      }
      (*pfVar9->to_str)(&local_48,url);
    }
    else {
      fio_ltocstr(&local_48,(long)url >> 1);
    }
LAB_0014f1f9:
    pcVar5 = local_48.data;
    uVar3 = CONCAT44(local_48.len._4_4_,(undefined4)local_48.len);
    file_ext = (char *)0x0;
    file_ext_len = 0;
    if (uVar3 < 2) goto LAB_0014f2b5;
    uVar12 = 1;
    bVar6 = 0;
    do {
      if (local_48.data[uVar3 - uVar12] == '/') break;
      if (local_48.data[uVar3 - uVar12] == '.') {
        if (bVar6 != 0) {
          file_ext_len = (size_t)bVar6;
          lVar2 = *in_FS_OFFSET;
          file_ext = (char *)(lVar2 + -0x10);
          *(undefined1 *)((long)in_FS_OFFSET + (file_ext_len - 0x10)) = 0;
          pp_Var7 = __ctype_tolower_loc();
          lVar14 = 0;
          do {
            *(char *)(file_ext_len + lVar2 + -0x11 + lVar14) =
                 (char)(*pp_Var7)[pcVar5[lVar14 + (uVar3 - 1)]];
            lVar14 = lVar14 + -1;
          } while (-lVar14 != file_ext_len);
          goto LAB_0014f2b5;
        }
        break;
      }
      bVar10 = bVar6 + 2;
      uVar12 = (ulong)bVar10;
      bVar6 = bVar6 + 1;
    } while (0xe < bVar10 || uVar12 < uVar3);
  }
  file_ext = (char *)0x0;
  file_ext_len = 0;
LAB_0014f2b5:
  FVar8 = http_mimetype_find(file_ext,file_ext_len);
  FVar4 = HTTP_HVALUE_CONTENT_TYPE_DEFAULT;
  if ((((FVar8 == 0) && (FVar8 = FVar4, (~(uint)HTTP_HVALUE_CONTENT_TYPE_DEFAULT & 6) != 0)) &&
      (HTTP_HVALUE_CONTENT_TYPE_DEFAULT != 0)) && ((HTTP_HVALUE_CONTENT_TYPE_DEFAULT & 1) == 0)) {
    LOCK();
    piVar1 = (int *)((HTTP_HVALUE_CONTENT_TYPE_DEFAULT & 0xfffffffffffffff8) + 4);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return FVar8;
}

Assistant:

FIOBJ http_mimetype_find2(FIOBJ url) {
  static __thread char buffer[LONGEST_FILE_EXTENSION_LENGTH + 1];
  fio_str_info_s ext = {.data = NULL};
  FIOBJ mimetype;
  if (!url)
    goto finish;
  fio_str_info_s tmp = fiobj_obj2cstr(url);
  uint8_t steps = 1;
  while (tmp.len > steps || steps >= LONGEST_FILE_EXTENSION_LENGTH) {
    switch (tmp.data[tmp.len - steps]) {
    case '.':
      --steps;
      if (steps) {
        ext.len = steps;
        ext.data = buffer;
        buffer[steps] = 0;
        for (size_t i = 1; i <= steps; ++i) {
          buffer[steps - i] = tolower(tmp.data[tmp.len - i]);
        }
      }
    /* fallthrough */
    case '/':
      goto finish;
      break;
    }
    ++steps;
  }
finish:
  mimetype = http_mimetype_find(ext.data, ext.len);
  if (!mimetype)
    mimetype = fiobj_dup(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
  return mimetype;
}